

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _bc_slist_t *key;
  long lVar1;
  FILE *__stream;
  char **str;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  bc_trie_t *pbVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  bc_slist_t *pbVar9;
  size_t sVar10;
  bc_slist_t *pbVar11;
  int *piVar12;
  char *pcVar13;
  bool bVar14;
  FILE *local_e8;
  FILE *fp;
  _Bool write_to_stdout;
  char *out;
  bc_slist_t *l;
  char *val;
  bc_trie_t *local;
  bc_trie_t *e;
  bc_slist_t *tmp_1;
  bc_slist_t *s;
  bc_error_t *err;
  bc_slist_t *input_list;
  char *input;
  size_t input_len;
  long lStack_78;
  char c;
  size_t j;
  size_t i;
  bc_trie_t *config;
  bc_slist_t *listing_entries_source;
  bc_slist_t *listing_entries;
  bc_slist_t *sources;
  char **pieces;
  char *tmp;
  char *print;
  char *output;
  char *template;
  _Bool listing;
  _Bool input_stdin;
  _Bool debug;
  char **ppcStack_18;
  int rv;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  setlocale(6,"");
  template._4_4_ = 0;
  template._3_1_ = 0;
  template._2_1_ = 0;
  template._1_1_ = 0;
  output = (char *)0x0;
  print = (char *)0x0;
  tmp = (char *)0x0;
  pieces = (char **)0x0;
  sources = (bc_slist_t *)0x0;
  listing_entries = (bc_slist_t *)0x0;
  listing_entries_source = (bc_slist_t *)0x0;
  config = (bc_trie_t *)0x0;
  pbVar5 = bc_trie_new(free);
  i = (size_t)pbVar5;
  pcVar6 = bc_strdup("0.20.1.29-b1ae");
  bc_trie_insert(pbVar5,"BLOGC_VERSION",pcVar6);
  for (j = 1; pbVar11 = listing_entries, pbVar9 = listing_entries_source,
      j < (ulong)(long)(int)argv_local; j = j + 1) {
    pieces = (char **)0x0;
    if (*ppcStack_18[j] == '-') {
      switch(ppcStack_18[j][1]) {
      case 'D':
        if (ppcStack_18[j][2] == '\0') {
          if (j + 1 < (ulong)(long)(int)argv_local) {
            pieces = (char **)ppcStack_18[j + 1];
            j = j + 1;
          }
        }
        else {
          pieces = (char **)(ppcStack_18[j] + 2);
        }
        str = pieces;
        if (pieces != (char **)0x0) {
          sVar10 = strlen((char *)pieces);
          _Var3 = bc_utf8_validate((uint8_t *)str,sVar10);
          if (!_Var3) {
            fprintf(_stderr,"blogc: error: invalid value for -D (must be valid UTF-8 string): %s\n",
                    pieces);
            goto LAB_00101de5;
          }
          sources = (bc_slist_t *)bc_str_split((char *)pieces,'=',2);
          sVar7 = bc_strv_length((char **)sources);
          sVar8 = i;
          if (sVar7 != 2) {
            fprintf(_stderr,"blogc: error: invalid value for -D (must have an \'=\'): %s\n",pieces);
            bc_strv_free((char **)sources);
            template._4_4_ = 1;
            goto LAB_00101de5;
          }
          for (lStack_78 = 0; *(char *)((long)&sources->next->next + lStack_78) != '\0';
              lStack_78 = lStack_78 + 1) {
            input_len._7_1_ = *(char *)((long)&sources->next->next + lStack_78);
            if (lStack_78 == 0) {
              if ((input_len._7_1_ < 'A') || ('Z' < input_len._7_1_)) {
                fprintf(_stderr,
                        "blogc: error: invalid value for -D (first character in configuration key must be uppercase): %s\n"
                        ,sources->next);
                bc_strv_free((char **)sources);
                template._4_4_ = 1;
                goto LAB_00101de5;
              }
            }
            else if ((((input_len._7_1_ < 'A') || ('Z' < input_len._7_1_)) &&
                     ((input_len._7_1_ < '0' || ('9' < input_len._7_1_)))) &&
                    (input_len._7_1_ != '_')) {
              fprintf(_stderr,
                      "blogc: error: invalid value for -D (configuration key must be uppercase with \'_\' and digits after first character): %s\n"
                      ,sources->next);
              bc_strv_free((char **)sources);
              template._4_4_ = 1;
              goto LAB_00101de5;
            }
          }
          key = sources->next;
          pcVar6 = bc_strdup((char *)sources->data);
          bc_trie_insert((bc_trie_t *)sVar8,(char *)key,pcVar6);
          bc_strv_free((char **)sources);
          sources = (bc_slist_t *)0x0;
        }
        break;
      default:
        blogc_print_usage();
        fprintf(_stderr,"blogc: error: invalid argument: -%c\n",(ulong)(uint)(int)ppcStack_18[j][1])
        ;
        template._4_4_ = 1;
        goto LAB_00101de5;
      case 'd':
        template._3_1_ = 1;
        break;
      case 'e':
        if (ppcStack_18[j][2] == '\0') {
          if (j + 1 < (ulong)(long)(int)argv_local) {
            lVar1 = j + 1;
            j = j + 1;
            pcVar6 = bc_strdup(ppcStack_18[lVar1]);
            listing_entries_source = bc_slist_append(pbVar9,pcVar6);
          }
        }
        else {
          pcVar6 = bc_strdup(ppcStack_18[j] + 2);
          listing_entries_source = bc_slist_append(pbVar9,pcVar6);
        }
        break;
      case 'h':
        blogc_print_help();
        goto LAB_00101de5;
      case 'i':
        template._2_1_ = 1;
        break;
      case 'l':
        template._1_1_ = 1;
        break;
      case 'o':
        if (ppcStack_18[j][2] == '\0') {
          if (j + 1 < (ulong)(long)(int)argv_local) {
            lVar1 = j + 1;
            j = j + 1;
            print = bc_strdup(ppcStack_18[lVar1]);
          }
        }
        else {
          print = bc_strdup(ppcStack_18[j] + 2);
        }
        break;
      case 'p':
        if (ppcStack_18[j][2] == '\0') {
          if (j + 1 < (ulong)(long)(int)argv_local) {
            lVar1 = j + 1;
            j = j + 1;
            tmp = bc_strdup(ppcStack_18[lVar1]);
          }
        }
        else {
          tmp = bc_strdup(ppcStack_18[j] + 2);
        }
        break;
      case 't':
        if (ppcStack_18[j][2] == '\0') {
          if (j + 1 < (ulong)(long)(int)argv_local) {
            lVar1 = j + 1;
            j = j + 1;
            output = bc_strdup(ppcStack_18[lVar1]);
          }
        }
        else {
          output = bc_strdup(ppcStack_18[j] + 2);
        }
        break;
      case 'v':
        printf("blogc 0.20.1.29-b1ae\n");
        goto LAB_00101de5;
      }
    }
    else {
      pcVar6 = bc_strdup(ppcStack_18[j]);
      listing_entries = bc_slist_append(pbVar11,pcVar6);
    }
  }
  if ((template._2_1_ & 1) != 0) {
    input_list = (bc_slist_t *)bc_stdin_read((size_t *)&input);
    err = (bc_error_t *)blogc_filelist_parse((char *)input_list,(size_t)input);
    free(input_list);
    listing_entries = bc_slist_append_list(listing_entries,(bc_slist_t *)err);
  }
  if (((template._1_1_ & 1) == 0) && (sVar8 = bc_slist_length(listing_entries), sVar8 == 0)) {
    blogc_print_usage();
    fprintf(_stderr,"blogc: error: one source file is required\n");
    template._4_4_ = 1;
    goto LAB_00101de5;
  }
  if (((template._1_1_ & 1) == 0) && (sVar8 = bc_slist_length(listing_entries), 1 < sVar8)) {
    blogc_print_usage();
    fprintf(_stderr,
            "blogc: error: only one source file should be provided, if running without \'-l\'\n");
    template._4_4_ = 1;
    goto LAB_00101de5;
  }
  s = (bc_slist_t *)0x0;
  pbVar9 = blogc_source_parse_from_files((bc_trie_t *)i,listing_entries,(bc_error_t **)&s);
  if (s == (bc_slist_t *)0x0) {
    if ((template._1_1_ & 1) != 0) {
      for (e = (bc_trie_t *)listing_entries_source; e != (bc_trie_t *)0x0; e = (bc_trie_t *)e->root)
      {
        sVar10 = strlen((char *)e->free_func);
        if (sVar10 == 0) {
          config = (bc_trie_t *)bc_slist_append((bc_slist_t *)config,(void *)0x0);
        }
        else {
          pbVar5 = blogc_source_parse_from_file
                             ((bc_trie_t *)i,(char *)e->free_func,(bc_error_t **)&s);
          if (s != (bc_slist_t *)0x0) {
            bc_error_print((bc_error_t *)s,"blogc");
            template._4_4_ = 1;
            goto LAB_00101dc6;
          }
          config = (bc_trie_t *)bc_slist_append((bc_slist_t *)config,pbVar5);
        }
      }
    }
    if (tmp == (char *)0x0) {
      if (output == (char *)0x0) {
        blogc_print_usage();
        fprintf(_stderr,"blogc: error: argument -t is required when rendering content\n");
        template._4_4_ = 1;
      }
      else {
        pbVar11 = blogc_template_parse_from_file(output,(bc_error_t **)&s);
        if (s == (bc_slist_t *)0x0) {
          if ((template._3_1_ & 1) != 0) {
            blogc_debug_template(pbVar11);
          }
          pcVar6 = blogc_render(pbVar11,pbVar9,(bc_slist_t *)config,(bc_trie_t *)i,
                                (_Bool)(template._1_1_ & 1));
          bVar14 = true;
          if (print != (char *)0x0) {
            iVar4 = strcmp(print,"-");
            bVar14 = iVar4 == 0;
          }
          local_e8 = _stdout;
          if (bVar14) {
LAB_00101d71:
            if (pcVar6 != (char *)0x0) {
              fprintf(local_e8,"%s",pcVar6);
            }
            if (!bVar14) {
              fclose(local_e8);
            }
          }
          else {
            blogc_mkdir_recursive(print);
            local_e8 = fopen(print,"w");
            pcVar2 = print;
            __stream = _stderr;
            if (local_e8 != (FILE *)0x0) goto LAB_00101d71;
            piVar12 = __errno_location();
            pcVar13 = strerror(*piVar12);
            fprintf(__stream,"blogc: error: failed to open output file (%s): %s\n",pcVar2,pcVar13);
            template._4_4_ = 1;
          }
          free(pcVar6);
        }
        else {
          bc_error_print((bc_error_t *)s,"blogc");
          template._4_4_ = 1;
        }
        blogc_template_free_ast(pbVar11);
      }
    }
    else {
      val = (char *)0x0;
      if (((template._1_1_ & 1) == 0) && (pbVar9 != (bc_slist_t *)0x0)) {
        val = (char *)pbVar9->data;
      }
      pcVar6 = blogc_format_variable
                         (tmp,(bc_trie_t *)i,(bc_trie_t *)val,(char *)0x0,(bc_slist_t *)0x0);
      if (pcVar6 == (char *)0x0) {
        fprintf(_stderr,"blogc: error: variable not found: %s\n",tmp);
        template._4_4_ = 0x4e;
      }
      else {
        printf("%s\n",pcVar6);
      }
      free(pcVar6);
    }
  }
  else {
    bc_error_print((bc_error_t *)s,"blogc");
    template._4_4_ = 1;
  }
LAB_00101dc6:
  bc_slist_free_full(pbVar9,bc_trie_free);
  bc_error_free((bc_error_t *)s);
LAB_00101de5:
  bc_trie_free((bc_trie_t *)i);
  free(output);
  free(print);
  free(tmp);
  bc_slist_free_full(listing_entries_source,free);
  bc_slist_free_full((bc_slist_t *)config,bc_trie_free);
  bc_slist_free_full(listing_entries,free);
  return template._4_4_;
}

Assistant:

int
main(int argc, char **argv)
{
    setlocale(LC_ALL, "");

    int rv = 0;

#ifdef MAKE_EMBEDDED
    bool embedded = false;
#endif
    bool debug = false;
    bool input_stdin = false;
    bool listing = false;
    char *template = NULL;
    char *output = NULL;
    char *print = NULL;
    char *tmp = NULL;
    char **pieces = NULL;

    bc_slist_t *sources = NULL;
    bc_slist_t *listing_entries = NULL;
    bc_slist_t *listing_entries_source = NULL;
    bc_trie_t *config = bc_trie_new(free);
    bc_trie_insert(config, "BLOGC_VERSION", bc_strdup(PACKAGE_VERSION));

    for (size_t i = 1; i < argc; i++) {
        tmp = NULL;
        if (argv[i][0] == '-') {
            switch (argv[i][1]) {
                case 'h':
                    blogc_print_help();
                    goto cleanup;
                case 'v':
                    printf("blogc " PACKAGE_VERSION "\n");
                    goto cleanup;
                case 'd':
                    debug = true;
                    break;
                case 'i':
                    input_stdin = true;
                    break;
                case 'l':
                    listing = true;
                    break;
                case 'e':
                    if (argv[i][2] != '\0')
                        listing_entries = bc_slist_append(listing_entries, bc_strdup(argv[i] + 2));
                    else if (i + 1 < argc)
                        listing_entries = bc_slist_append(listing_entries, bc_strdup(argv[++i]));
                    break;
                case 't':
                    if (argv[i][2] != '\0')
                        template = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        template = bc_strdup(argv[++i]);
                    break;
                case 'o':
                    if (argv[i][2] != '\0')
                        output = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        output = bc_strdup(argv[++i]);
                    break;
                case 'p':
                    if (argv[i][2] != '\0')
                        print = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        print = bc_strdup(argv[++i]);
                    break;
                case 'D':
                    if (argv[i][2] != '\0')
                        tmp = argv[i] + 2;
                    else if (i + 1 < argc)
                        tmp = argv[++i];
                    if (tmp != NULL) {
                        if (!bc_utf8_validate((uint8_t*) tmp, strlen(tmp))) {
                            fprintf(stderr, "blogc: error: invalid value for "
                                "-D (must be valid UTF-8 string): %s\n", tmp);
                            goto cleanup;
                        }
                        pieces = bc_str_split(tmp, '=', 2);
                        if (bc_strv_length(pieces) != 2) {
                            fprintf(stderr, "blogc: error: invalid value for "
                                "-D (must have an '='): %s\n", tmp);
                            bc_strv_free(pieces);
                            rv = 1;
                            goto cleanup;
                        }
                        for (size_t j = 0; pieces[0][j] != '\0'; j++) {
                            char c = pieces[0][j];
                            if (j == 0) {
                                if (!(c >= 'A' && c <= 'Z')) {
                                    fprintf(stderr, "blogc: error: invalid value "
                                        "for -D (first character in configuration "
                                        "key must be uppercase): %s\n", pieces[0]);
                                    bc_strv_free(pieces);
                                    rv = 1;
                                    goto cleanup;
                                }
                                continue;
                            }
                            if (!((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')) {
                                fprintf(stderr, "blogc: error: invalid value "
                                    "for -D (configuration key must be uppercase "
                                    "with '_' and digits after first character): %s\n",
                                    pieces[0]);
                                bc_strv_free(pieces);
                                rv = 1;
                                goto cleanup;
                            }
                        }
                        bc_trie_insert(config, pieces[0], bc_strdup(pieces[1]));
                        bc_strv_free(pieces);
                        pieces = NULL;
                    }
                    break;
#ifdef MAKE_EMBEDDED
                case 'm':
                    embedded = true;
                    break;
#endif
                default:
                    blogc_print_usage();
                    fprintf(stderr, "blogc: error: invalid argument: -%c\n",
                        argv[i][1]);
                    rv = 1;
                    goto cleanup;
            }
        }
        else {
            sources = bc_slist_append(sources, bc_strdup(argv[i]));
        }

#ifdef MAKE_EMBEDDED
        if (embedded) {
            rv = bm_main(argc, argv);
            goto cleanup;
        }
#endif

    }

    if (input_stdin) {
        size_t input_len;
        char *input = bc_stdin_read(&input_len);
        bc_slist_t *input_list = blogc_filelist_parse(input, input_len);
        free(input);
        sources = bc_slist_append_list(sources, input_list);
    }

    if (!listing && bc_slist_length(sources) == 0) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: one source file is required\n");
        rv = 1;
        goto cleanup;
    }

    if (!listing && bc_slist_length(sources) > 1) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: only one source file should be provided, "
            "if running without '-l'\n");
        rv = 1;
        goto cleanup;
    }

    bc_error_t *err = NULL;

    bc_slist_t *s = blogc_source_parse_from_files(config, sources, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        rv = 1;
        goto cleanup2;
    }

    if (listing) {
        for (bc_slist_t *tmp = listing_entries; tmp != NULL; tmp = tmp->next) {
            if (0 == strlen(tmp->data)) {
                listing_entries_source = bc_slist_append(listing_entries_source, NULL);
                continue;
            }
            bc_trie_t *e = blogc_source_parse_from_file(config, tmp->data, &err);
            if (err != NULL) {
                bc_error_print(err, "blogc");
                rv = 1;
                goto cleanup2;
            }
            listing_entries_source = bc_slist_append(listing_entries_source, e);
        }
    }

    if (print != NULL) {
        bc_trie_t *local = NULL;
        if (!listing && s != NULL) {
            local = s->data;
        }
        char *val = blogc_format_variable(print, config, local, NULL, NULL);
        if (val == NULL) {
            fprintf(stderr, "blogc: error: variable not found: %s\n",
                print);
            rv = EX_CONFIG;
        }
        else {
            printf("%s\n", val);
        }
        free(val);
        goto cleanup2;
    }

    if (template == NULL) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: argument -t is required when rendering content\n");
        rv = 1;
        goto cleanup2;
    }

    bc_slist_t* l = blogc_template_parse_from_file(template, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        rv = 1;
        goto cleanup3;
    }

    if (debug)
        blogc_debug_template(l);

    char *out = blogc_render(l, s, listing_entries_source, config, listing);

    bool write_to_stdout = (output == NULL || (0 == strcmp(output, "-")));

    FILE *fp = stdout;
    if (!write_to_stdout) {
        blogc_mkdir_recursive(output);
        fp = fopen(output, "w");
        if (fp == NULL) {
            fprintf(stderr, "blogc: error: failed to open output file (%s): %s\n",
                output, strerror(errno));
            rv = 1;
            goto cleanup4;
        }
    }

    if (out != NULL)
        fprintf(fp, "%s", out);

    if (!write_to_stdout)
        fclose(fp);

cleanup4:
    free(out);
cleanup3:
    blogc_template_free_ast(l);
cleanup2:
    bc_slist_free_full(s, (bc_free_func_t) bc_trie_free);
    bc_error_free(err);
cleanup:
    bc_trie_free(config);
    free(template);
    free(output);
    free(print);
    bc_slist_free_full(listing_entries, free);
    bc_slist_free_full(listing_entries_source, (bc_free_func_t) bc_trie_free);
    bc_slist_free_full(sources, free);
    return rv;
}